

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash.c
# Opt level: O0

int hash_step(gost_ctx *c,byte *H,byte *M)

{
  byte *in_RDX;
  byte *in_RSI;
  int i;
  byte Key [32];
  byte S [32];
  byte V [32];
  byte W [32];
  byte U [32];
  byte *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar1;
  byte *in_stack_ffffffffffffff48;
  gost_ctx *in_stack_ffffffffffffff50;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  byte local_78 [32];
  byte local_58 [32];
  byte local_38;
  byte local_37;
  byte local_35;
  byte local_33;
  byte local_31;
  byte local_30;
  byte local_2e;
  byte local_2c;
  byte local_2a;
  byte local_27;
  byte local_26;
  byte local_24;
  byte local_21;
  byte local_20;
  byte local_1c;
  byte local_1b;
  byte local_19;
  byte *local_18;
  byte *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  xor_blocks(local_58,in_RSI,in_RDX,0x20);
  swap_bytes(local_58,&stack0xffffffffffffff48);
  gost_enc_with_key(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                    (byte *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                    in_stack_ffffffffffffff38);
  circle_xor8(local_10,&local_38);
  circle_xor8(local_18,local_78);
  circle_xor8(local_78,local_78);
  xor_blocks(local_58,&local_38,local_78,0x20);
  swap_bytes(local_58,&stack0xffffffffffffff48);
  gost_enc_with_key(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                    (byte *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                    in_stack_ffffffffffffff38);
  circle_xor8(&local_38,&local_38);
  local_19 = local_19 ^ 0xff;
  local_1b = local_1b ^ 0xff;
  local_1c = local_1c ^ 0xff;
  local_20 = local_20 ^ 0xff;
  local_21 = local_21 ^ 0xff;
  local_24 = local_24 ^ 0xff;
  local_26 = local_26 ^ 0xff;
  local_27 = local_27 ^ 0xff;
  local_2a = local_2a ^ 0xff;
  local_2c = local_2c ^ 0xff;
  local_2e = local_2e ^ 0xff;
  local_30 = local_30 ^ 0xff;
  local_31 = local_31 ^ 0xff;
  local_33 = local_33 ^ 0xff;
  local_35 = local_35 ^ 0xff;
  local_37 = local_37 ^ 0xff;
  circle_xor8(local_78,local_78);
  circle_xor8(local_78,local_78);
  xor_blocks(local_58,&local_38,local_78,0x20);
  swap_bytes(local_58,&stack0xffffffffffffff48);
  gost_enc_with_key(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                    (byte *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                    in_stack_ffffffffffffff38);
  circle_xor8(&local_38,&local_38);
  circle_xor8(local_78,local_78);
  circle_xor8(local_78,local_78);
  xor_blocks(local_58,&local_38,local_78,0x20);
  swap_bytes(local_58,&stack0xffffffffffffff48);
  gost_enc_with_key(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                    (byte *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                    in_stack_ffffffffffffff38);
  for (iVar1 = 0; iVar1 < 0xc; iVar1 = iVar1 + 1) {
    transform_3((byte *)&local_98);
  }
  xor_blocks((byte *)&local_98,(byte *)&local_98,local_18,0x20);
  transform_3((byte *)&local_98);
  xor_blocks((byte *)&local_98,(byte *)&local_98,local_10,0x20);
  for (iVar1 = 0; iVar1 < 0x3d; iVar1 = iVar1 + 1) {
    transform_3((byte *)&local_98);
  }
  *(undefined8 *)local_10 = local_98;
  *(undefined8 *)(local_10 + 8) = local_90;
  *(undefined8 *)(local_10 + 0x10) = local_88;
  *(undefined8 *)(local_10 + 0x18) = local_80;
  return 1;
}

Assistant:

static int hash_step(gost_ctx * c, byte * H, const byte * M)
{
    byte U[32], W[32], V[32], S[32], Key[32];
    int i;
    /* Compute first key */
    xor_blocks(W, H, M, 32);
    swap_bytes(W, Key);
    /* Encrypt first 8 bytes of H with first key */
    gost_enc_with_key(c, Key, H, S);
    /* Compute second key */
    circle_xor8(H, U);
    circle_xor8(M, V);
    circle_xor8(V, V);
    xor_blocks(W, U, V, 32);
    swap_bytes(W, Key);
    /* encrypt second 8 bytes of H with second key */
    gost_enc_with_key(c, Key, H + 8, S + 8);
    /* compute third key */
    circle_xor8(U, U);
    U[31] = ~U[31];
    U[29] = ~U[29];
    U[28] = ~U[28];
    U[24] = ~U[24];
    U[23] = ~U[23];
    U[20] = ~U[20];
    U[18] = ~U[18];
    U[17] = ~U[17];
    U[14] = ~U[14];
    U[12] = ~U[12];
    U[10] = ~U[10];
    U[8] = ~U[8];
    U[7] = ~U[7];
    U[5] = ~U[5];
    U[3] = ~U[3];
    U[1] = ~U[1];
    circle_xor8(V, V);
    circle_xor8(V, V);
    xor_blocks(W, U, V, 32);
    swap_bytes(W, Key);
    /* encrypt third 8 bytes of H with third key */
    gost_enc_with_key(c, Key, H + 16, S + 16);
    /* Compute fourth key */
    circle_xor8(U, U);
    circle_xor8(V, V);
    circle_xor8(V, V);
    xor_blocks(W, U, V, 32);
    swap_bytes(W, Key);
    /* Encrypt last 8 bytes with fourth key */
    gost_enc_with_key(c, Key, H + 24, S + 24);
    for (i = 0; i < 12; i++)
        transform_3(S);
    xor_blocks(S, S, M, 32);
    transform_3(S);
    xor_blocks(S, S, H, 32);
    for (i = 0; i < 61; i++)
        transform_3(S);
    memcpy(H, S, 32);
    return 1;
}